

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O1

char * Abc_NtkCollectLatchValuesStr(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  pcVar3 = (char *)malloc((long)pNtk->nObjCounts[8] + 1);
  lVar6 = (long)pNtk->vBoxes->nSize;
  if (lVar6 < 1) {
    lVar5 = 0;
  }
  else {
    ppvVar1 = pNtk->vBoxes->pArray;
    lVar5 = 0;
    do {
      pvVar2 = ppvVar1[lVar5];
      if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8) {
        uVar4 = *(long *)((long)pvVar2 + 0x38) - 1;
        if (2 < uVar4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                        ,0xe3,"char *Abc_NtkCollectLatchValuesStr(Abc_Ntk_t *)");
        }
        pcVar3[lVar5] = (char)(0x783130 >> ((byte)((int)uVar4 << 3) & 0x1f));
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  pcVar3[lVar5] = '\0';
  return pcVar3;
}

Assistant:

char * Abc_NtkCollectLatchValuesStr( Abc_Ntk_t * pNtk )
{
    char * pInits;
    Abc_Obj_t * pLatch;
    int i;
    pInits = ABC_ALLOC( char, Abc_NtkLatchNum(pNtk) + 1 );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_LatchIsInit0(pLatch) )
            pInits[i] = '0';
        else if ( Abc_LatchIsInit1(pLatch) )
            pInits[i] = '1';
        else if ( Abc_LatchIsInitDc(pLatch) )
            pInits[i] = 'x';
        else
            assert( 0 );
    }
    pInits[i] = 0;
    return pInits;
}